

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O1

int corpus_next_utt(void)

{
  char *pcVar1;
  int iVar2;
  lineiter_t *plVar3;
  uint32 *in_RCX;
  uint32 *sf;
  char **in_RSI;
  char **in_R8;
  
  if (cur_ctl_path != (char *)0x0) {
    free(cur_ctl_path);
  }
  pcVar1 = next_ctl_path;
  cur_ctl_path = next_ctl_path;
  if (cur_ctl_utt_id != (char *)0x0) {
    free(cur_ctl_utt_id);
  }
  cur_ctl_utt_id = next_ctl_utt_id;
  cur_ctl_sf = next_ctl_sf;
  cur_ctl_ef = next_ctl_ef;
  if (n_run != 0xffffffff) {
    if (n_run == 0) {
      cur_ctl_sf = next_ctl_sf;
      cur_ctl_ef = next_ctl_ef;
      cur_ctl_utt_id = next_ctl_utt_id;
      return 0;
    }
    n_run = n_run - 1;
  }
  n_proc = n_proc + 1;
  iVar2 = 0;
  if ((pcVar1 != (char *)0x0) && (iVar2 = 0, *pcVar1 != '\0')) {
    if (transcription_fp != (FILE *)0x0) {
      plVar3 = lineiter_start_clean(transcription_fp);
      if (plVar3 == (lineiter_t *)0x0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                ,0x456,"File length mismatch at line %d in %s\n",(ulong)n_proc,
                transcription_filename);
        exit(1);
      }
      if (transcription_line != (char *)0x0) {
        free(transcription_line);
      }
      transcription_line = strdup(plVar3->buf);
      lineiter_free(plVar3);
    }
    plVar3 = lineiter_start_clean(ctl_fp);
    if (plVar3 == (lineiter_t *)0x0) {
      next_ctl_path = (char *)0x0;
      next_ctl_sf = 0xffffffff;
      next_ctl_ef = 0xffffffff;
      next_ctl_utt_id = (char *)0x0;
    }
    else {
      parse_ctl_line(plVar3->buf,in_RSI,sf,in_RCX,in_R8);
      lineiter_free(plVar3);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
corpus_next_utt()
{
    lineiter_t *li;
    
    if (cur_ctl_path) {
	free(cur_ctl_path);
    }
    cur_ctl_path = next_ctl_path;

    if (cur_ctl_utt_id) {
	free(cur_ctl_utt_id);
	cur_ctl_utt_id = NULL;
    }
    cur_ctl_utt_id = next_ctl_utt_id;
    
    cur_ctl_sf = next_ctl_sf;
    cur_ctl_ef = next_ctl_ef;

    if (n_run != UNTIL_EOF) {
	if (n_run == 0) return FALSE;

	--n_run;
    }

    ++n_proc;

    if (cur_ctl_path == NULL || strlen(cur_ctl_path) == 0)
	return FALSE;

    /* if a big LSN file exists, position it to the correct line
     * corpus_set_ctl_filename() reads the first line of
     * the control file, so that transcription_fp is one line
     * behind ctl_fp. */
    if (transcription_fp) {
	lineiter_t *trans_li;
	trans_li = lineiter_start_clean(transcription_fp);
	if (trans_li == NULL) {
	    E_FATAL("File length mismatch at line %d in %s\n", n_proc, transcription_filename);
	}
	if (transcription_line)
	    free(transcription_line);
	transcription_line = strdup(trans_li->buf);
	lineiter_free(trans_li);
    }  

    li = lineiter_start_clean(ctl_fp);

    if (li != NULL) {
        parse_ctl_line(li->buf,
                       &next_ctl_path,
                       &next_ctl_sf,
                       &next_ctl_ef,
                       &next_ctl_utt_id);
        lineiter_free (li);
    } else {
        next_ctl_path = NULL;
        next_ctl_sf = NO_FRAME;
        next_ctl_ef = NO_FRAME;
        next_ctl_utt_id = NULL;
    }

    return TRUE;
}